

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

void __thiscall
VariationalBayesEstimatorOnLDA::writeParameter
          (VariationalBayesEstimatorOnLDA *this,string *thetaFilename,string *phiFilename,
          string *alphaFilename,string *betaFilename)

{
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [48];
  string local_50 [32];
  string *local_30;
  string *betaFilename_local;
  string *alphaFilename_local;
  string *phiFilename_local;
  string *thetaFilename_local;
  VariationalBayesEstimatorOnLDA *this_local;
  
  local_30 = betaFilename;
  betaFilename_local = alphaFilename;
  alphaFilename_local = phiFilename;
  phiFilename_local = thetaFilename;
  thetaFilename_local = (string *)this;
  std::__cxx11::string::string(local_50,(string *)thetaFilename);
  outputVector<double>(&this->_thetaEx,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string(local_80,(string *)phiFilename);
  outputVector<double>(&this->_phiEx,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::string(local_a0,(string *)alphaFilename);
  outputVector<double>(&this->_alphaTimeSeries,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::string(local_c0,(string *)betaFilename);
  outputVector<double>(&this->_betaTimeSeries,(string *)local_c0);
  std::__cxx11::string::~string(local_c0);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::writeParameter(string thetaFilename, string phiFilename, string alphaFilename, string betaFilename)const{//{{{
    outputVector(_thetaEx, thetaFilename);
    outputVector(_phiEx, phiFilename);
    outputVector(_alphaTimeSeries, alphaFilename);
    outputVector(_betaTimeSeries, betaFilename);
}